

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void ptrobj_delete(t_ptrobj *x)

{
  t_gstub *ptVar1;
  _glist *x_00;
  t_symbol *ptVar2;
  t_pd p_Var3;
  t_gpointer *gp_00;
  t_symbol *ptVar4;
  bool bVar5;
  t_symbol *templatesym;
  t_scalar *sc;
  t_typedout *ptStack_40;
  int n;
  t_typedout *to;
  _glist *glist;
  t_gstub *gs;
  t_gpointer *gp;
  t_gobj *old;
  t_gobj *gobj;
  t_ptrobj *x_local;
  
  gp_00 = &x->x_gp;
  ptVar1 = (x->x_gp).gp_stub;
  if (ptVar1 == (t_gstub *)0x0) {
    pd_error(x,"pointer delete: no current pointer");
  }
  else if (ptVar1->gs_which == 1) {
    x_00 = (ptVar1->gs_un).gs_glist;
    if (x_00->gl_valid == (x->x_gp).gp_valid) {
      if ((gp_00->gp_un).gp_scalar == (_scalar *)0x0) {
        pd_error(x,"pointer delete: pointing to head");
      }
      else {
        ptVar2 = ((gp_00->gp_un).gp_scalar)->sc_template;
        ptVar4 = gensym("pd-text");
        if (ptVar2 == ptVar4) {
          pd_error(x,"pointer delete: can\'t delete \'pd-text\' scalar");
        }
        else {
          ptVar2 = ((gp_00->gp_un).gp_scalar)->sc_template;
          ptVar4 = gensym("pd-float-array");
          if (ptVar2 == ptVar4) {
            pd_error(x,"pointer delete: can\'t delete \'pd-float-array\' scalar");
          }
          else {
            old = (((gp_00->gp_un).gp_scalar)->sc_gobj).g_next;
            while( true ) {
              bVar5 = false;
              if (old != (t_gobj *)0x0) {
                bVar5 = old->g_pd != scalar_class;
              }
              if (!bVar5) break;
              old = old->g_next;
            }
            glist_delete(x_00,&((gp_00->gp_un).gp_scalar)->sc_gobj);
            (x->x_gp).gp_valid = x_00->gl_valid;
            if (old == (t_gobj *)0x0) {
              gpointer_unset(gp_00);
              outlet_bang(x->x_bangout);
            }
            else {
              p_Var3 = old[1].g_pd;
              (gp_00->gp_un).gp_scalar = (_scalar *)old;
              ptStack_40 = x->x_typedout;
              sc._4_4_ = x->x_ntypedout;
              while (sc._4_4_ != 0) {
                if ((t_pd)ptStack_40->to_type == p_Var3) {
                  outlet_pointer(ptStack_40->to_outlet,&x->x_gp);
                  return;
                }
                ptStack_40 = ptStack_40 + 1;
                sc._4_4_ = sc._4_4_ + -1;
              }
              outlet_pointer(x->x_otherout,&x->x_gp);
            }
          }
        }
      }
    }
    else {
      pd_error(x,"pointer delete: stale pointer");
    }
  }
  else {
    pd_error(x,"pointer delete: lists only, not arrays");
  }
  return;
}

Assistant:

static void ptrobj_delete(t_ptrobj *x)
{
    t_gobj *gobj, *old;
    t_gpointer *gp = &x->x_gp;
    t_gstub *gs = gp->gp_stub;
    t_glist *glist;
    if (!gs)
    {
        pd_error(x, "pointer delete: no current pointer");
        return;
    }
    if (gs->gs_which != GP_GLIST)
    {
        pd_error(x, "pointer delete: lists only, not arrays");
        return;
    }
    glist = gs->gs_un.gs_glist;
    if (glist->gl_valid != gp->gp_valid)
    {
        pd_error(x, "pointer delete: stale pointer");
        return;
    }
    if (!gp->gp_un.gp_scalar)
    {
        pd_error(x, "pointer delete: pointing to head");
        return;
    }
    if (gp->gp_un.gp_scalar->sc_template == gensym("pd-text"))
    {
        pd_error(x, "pointer delete: can't delete 'pd-text' scalar");
        return;
    }
    if (gp->gp_un.gp_scalar->sc_template == gensym("pd-float-array"))
    {
        pd_error(x, "pointer delete: can't delete 'pd-float-array' scalar");
        return;
    }

    old = &gp->gp_un.gp_scalar->sc_gobj;
    gobj = old->g_next;
    while (gobj && (pd_class(&gobj->g_pd) != scalar_class))
        gobj = gobj->g_next;
    glist_delete(glist, old);
    gp->gp_valid = glist->gl_valid;
    if (gobj)
    {
        t_typedout *to;
        int n;
        t_scalar *sc = (t_scalar *)gobj;
        t_symbol *templatesym = sc->sc_template;

        gp->gp_un.gp_scalar = sc;
        for (n = x->x_ntypedout, to = x->x_typedout; n--; to++)
        {
            if (to->to_type == templatesym)
            {
                outlet_pointer(to->to_outlet, &x->x_gp);
                return;
            }
        }
        outlet_pointer(x->x_otherout, &x->x_gp);
    }
    else
    {
        gpointer_unset(gp);
        outlet_bang(x->x_bangout);
    }
}